

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementShellBST::ChElementShellBST(ChElementShellBST *this)

{
  undefined1 auVar1 [64];
  
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_ChElementShell).super_ChElementGeneric.Kmatr.variables.
           super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl
           .super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_ChElementShell).mass = 0.0;
  auVar1 = ZEXT464(0) << 0x40;
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x1184598;
  this->super_ChLoadableUV = (ChLoadableUV)0x1184770;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x1184868;
  this->m_nodes =
       (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
        )auVar1._0_24_;
  this->m_layers =
       (vector<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
        )auVar1._24_24_;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar1._48_8_;
  (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar1._56_8_;
  *(undefined1 (*) [64])
   &(this->m_nodes).
    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar1;
  this->l0 = (ChVector<double>)auVar1._0_24_;
  this->cM[0] = (ChVector<double>)auVar1._24_24_;
  this->cM[1].m_data[0] = (double)auVar1._48_8_;
  this->cM[1].m_data[1] = (double)auVar1._56_8_;
  *(undefined1 (*) [64])(this->cM[1].m_data + 2) = auVar1;
  *(undefined1 (*) [64])(this->cI[1].m_data + 1) = auVar1;
  this->phi0 = (ChVector<double>)auVar1._0_24_;
  this->phi = (ChVector<double>)auVar1._24_24_;
  (this->k0).m_data[0] = (double)auVar1._48_8_;
  (this->k0).m_data[1] = (double)auVar1._56_8_;
  *(undefined1 (*) [64])((this->k0).m_data + 2) = auVar1;
  *(undefined1 (*) [64])((this->e).m_data + 1) = auVar1;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::resize(&this->m_nodes,6);
  this->n_usednodes = 6;
  return;
}

Assistant:

ChElementShellBST::ChElementShellBST() : tot_thickness(0) {
    m_nodes.resize(6);

	n_usednodes = 6;

}